

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

string * stringformat<int,int>(string *__return_storage_ptr__,char *fmt,int *args,int *args_1)

{
  stringstream buf;
  int local_1b0;
  int local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1b0 = *args_1;
  local_1ac = *args;
  StringFormatter<int,int>::format<int_const,int_const&>(local_198,fmt,&local_1ac,&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}